

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Ses_StoreClean(Ses_Store_t *pStore)

{
  Ses_TimesEntry_t *pSVar1;
  Ses_TruthEntry_t *pSVar2;
  Ses_TimesEntry_t *pTiEntry2;
  Ses_TimesEntry_t *pTiEntry;
  Ses_TruthEntry_t *pTEntry2;
  Ses_TruthEntry_t *pTEntry;
  int i;
  Ses_Store_t *pStore_local;
  
  for (pTEntry._4_4_ = 0; pTEntry._4_4_ < 0x400; pTEntry._4_4_ = pTEntry._4_4_ + 1) {
    if (pStore->pEntries[pTEntry._4_4_] != (Ses_TruthEntry_t *)0x0) {
      pSVar2 = pStore->pEntries[pTEntry._4_4_];
      while (pTEntry2 = pSVar2, pTEntry2 != (Ses_TruthEntry_t *)0x0) {
        pSVar1 = pTEntry2->head;
        while (pTiEntry2 = pSVar1, pTiEntry2 != (Ses_TimesEntry_t *)0x0) {
          if (pTiEntry2->pNetwork != (char *)0x0) {
            free(pTiEntry2->pNetwork);
            pTiEntry2->pNetwork = (char *)0x0;
          }
          pSVar1 = pTiEntry2->next;
          if (pTiEntry2 != (Ses_TimesEntry_t *)0x0) {
            free(pTiEntry2);
          }
        }
        pSVar2 = pTEntry2->next;
        if (pTEntry2 != (Ses_TruthEntry_t *)0x0) {
          free(pTEntry2);
        }
      }
    }
  }
  sat_solver_delete(pStore->pSat);
  if ((pStore->szDBName != (char *)0x0) && (pStore->szDBName != (char *)0x0)) {
    free(pStore->szDBName);
    pStore->szDBName = (char *)0x0;
  }
  if (pStore != (Ses_Store_t *)0x0) {
    free(pStore);
  }
  return;
}

Assistant:

static inline void Ses_StoreClean( Ses_Store_t * pStore )
{
    int i;
    Ses_TruthEntry_t * pTEntry, * pTEntry2;
    Ses_TimesEntry_t * pTiEntry, * pTiEntry2;

    for ( i = 0; i < SES_STORE_TABLE_SIZE; ++i )
        if ( pStore->pEntries[i] )
        {
            pTEntry = pStore->pEntries[i];

            while ( pTEntry )
            {
                pTiEntry = pTEntry->head;
                while ( pTiEntry )
                {
                    ABC_FREE( pTiEntry->pNetwork );
                    pTiEntry2 = pTiEntry;
                    pTiEntry = pTiEntry->next;
                    ABC_FREE( pTiEntry2 );
                }
                pTEntry2 = pTEntry;
                pTEntry = pTEntry->next;
                ABC_FREE( pTEntry2 );
            }
        }

    sat_solver_delete( pStore->pSat );

    if ( pStore->szDBName )
        ABC_FREE( pStore->szDBName );
    ABC_FREE( pStore );
}